

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_44c526::TransformActionGenexStrip::operator()
          (string *__return_storage_ptr__,TransformActionGenexStrip *this,string *s)

{
  TransformSelector *pTVar1;
  int iVar2;
  
  pTVar1 = (this->super_TransformAction).Selector;
  iVar2 = (*(pTVar1->super_TransformSelector)._vptr_TransformSelector[4])(pTVar1,s);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    cmGeneratorExpression::Preprocess(__return_storage_ptr__,s,StripAllGeneratorExpressions,false);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string& s) override
  {
    if (this->Selector->InSelection(s)) {
      return cmGeneratorExpression::Preprocess(
        s, cmGeneratorExpression::StripAllGeneratorExpressions);
    }

    return s;
  }